

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O3

Am_Object __thiscall
Am_Priority_List::Get
          (Am_Priority_List *this,float *main_priority,int *second_priority,int *third_priority)

{
  Am_Object *prev;
  undefined4 *in_R8;
  
  prev = *(Am_Object **)(main_priority + 2);
  if (prev != (Am_Object *)0x0) {
    *second_priority = *(int *)&prev[1].data;
    *third_priority = *(int *)((long)&prev[1].data + 4);
    *in_R8 = *(undefined4 *)&prev[2].data;
    Am_Object::Am_Object((Am_Object *)this,prev);
    return (Am_Object)(Am_Object_Data *)this;
  }
  Am_Error("Call to Get on priority list but no current item");
}

Assistant:

Am_Object
Am_Priority_List::Get(float &main_priority, int &second_priority,
                      int &third_priority)
{
  if (current) {
    main_priority = current->main_priority;
    second_priority = current->second_priority;
    third_priority = current->third_priority;
    return current->obj;
  } else {
    Am_Error("Call to Get on priority list but no current item");
    return nullptr;
  }
}